

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O0

void __thiscall higan::TcpConnection::ConnectionEstablished(TcpConnection *this)

{
  bool bVar1;
  enable_shared_from_this<higan::TcpConnection> local_20;
  TcpConnection *local_10;
  TcpConnection *this_local;
  
  local_10 = this;
  bVar1 = std::function::operator_cast_to_bool((function *)&this->new_connection_callback_);
  if (bVar1) {
    std::enable_shared_from_this<higan::TcpConnection>::shared_from_this(&local_20);
    std::function<void_(const_std::shared_ptr<higan::TcpConnection>_&)>::operator()
              (&this->new_connection_callback_,(shared_ptr<higan::TcpConnection> *)&local_20);
    std::shared_ptr<higan::TcpConnection>::~shared_ptr
              ((shared_ptr<higan::TcpConnection> *)&local_20);
  }
  Channel::EnableReadable(&this->channel_);
  this->connecting_ = true;
  return;
}

Assistant:

void TcpConnection::ConnectionEstablished()
{
	if (new_connection_callback_)
	{
		new_connection_callback_(shared_from_this());
	}

	channel_.EnableReadable();
	connecting_ = true;
}